

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trajectory.hpp
# Opt level: O0

void __thiscall
ruckig::Trajectory<3UL,_ruckig::StandardVector>::at_time
          (Trajectory<3UL,_ruckig::StandardVector> *this,double time,Vector<double> *new_position,
          Vector<double> *new_velocity,Vector<double> *new_acceleration)

{
  anon_class_24_3_cb1bcd32 local_50;
  size_t local_38;
  size_t new_section;
  Vector<double> *new_acceleration_local;
  Vector<double> *new_velocity_local;
  Vector<double> *new_position_local;
  double time_local;
  Trajectory<3UL,_ruckig::StandardVector> *this_local;
  
  local_50.new_position = new_position;
  local_50.new_velocity = new_velocity;
  local_50.new_acceleration = new_acceleration;
  new_section = (size_t)new_acceleration;
  new_acceleration_local = new_velocity;
  new_velocity_local = new_position;
  new_position_local = (Vector<double> *)time;
  time_local = (double)this;
  Trajectory<3ul,ruckig::StandardVector>::
  state_to_integrate_from<ruckig::Trajectory<3ul,ruckig::StandardVector>::at_time(double,std::array<double,3ul>&,std::array<double,3ul>&,std::array<double,3ul>&)const::_lambda(unsigned_long,double,double,double,double,double)_1_>
            ((Trajectory<3ul,ruckig::StandardVector> *)this,time,&local_38,&local_50);
  return;
}

Assistant:

void at_time(double time, Vector<double>& new_position, Vector<double>& new_velocity, Vector<double>& new_acceleration) const {
        if constexpr (DOFs == 0) {
            if (degrees_of_freedom != new_position.size() || degrees_of_freedom != new_velocity.size() || degrees_of_freedom != new_acceleration.size()) {
                throw RuckigError("mismatch in degrees of freedom (vector size).");
            }
        }

        size_t new_section;
        state_to_integrate_from(time, new_section, [&](size_t dof, double t, double p, double v, double a, double j) {
            std::tie(new_position[dof], new_velocity[dof], new_acceleration[dof]) = integrate(t, p, v, a, j);
        });
    }